

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# databaseinfo.cpp
# Opt level: O0

void __thiscall DatabaseInfo::acceptWidget(DatabaseInfo *this,DomWidget *node)

{
  long lVar1;
  bool bVar2;
  DomProperty *pDVar3;
  DomStringList *pDVar4;
  qsizetype qVar5;
  QString *in_RDI;
  long in_FS_OFFSET;
  QString *connection;
  DomProperty *db;
  DomProperty *frameworkCode;
  QString field;
  QString table;
  QStringList info;
  QHash<QString,_DomProperty_*> properties;
  DomProperty *in_stack_ffffffffffffff08;
  undefined7 in_stack_ffffffffffffff10;
  undefined1 in_stack_ffffffffffffff17;
  byte local_d9;
  undefined4 in_stack_ffffffffffffff38;
  uint uVar6;
  uint in_stack_ffffffffffffff3c;
  DomWidget *in_stack_ffffffffffffff88;
  QString *in_stack_ffffffffffffff90;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  DomWidget::elementProperty((DomWidget *)in_stack_ffffffffffffff08);
  propertyMap((QList<DomProperty_*> *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38))
  ;
  QList<DomProperty_*>::~QList((QList<DomProperty_*> *)0x173ae3);
  Qt::Literals::StringLiterals::operator____L1
            ((char *)in_RDI,CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10));
  pDVar3 = QHash<QString,_DomProperty_*>::value<QLatin1String,_true>
                     ((QHash<QString,_DomProperty_*> *)in_RDI,
                      (QLatin1String *)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10)
                     );
  in_stack_ffffffffffffff3c = in_stack_ffffffffffffff3c & 0xffffff;
  local_d9 = 0;
  if (pDVar3 != (DomProperty *)0x0) {
    DomProperty::elementBool(in_stack_ffffffffffffff08);
    in_stack_ffffffffffffff3c = CONCAT13(1,(int3)in_stack_ffffffffffffff3c);
    bVar2 = toBool(in_RDI);
    local_d9 = bVar2 ^ 0xff;
  }
  if ((in_stack_ffffffffffffff3c & 0x1000000) != 0) {
    QString::~QString((QString *)0x173b7c);
  }
  if ((local_d9 & 1) != 0) goto LAB_00173e29;
  Qt::Literals::StringLiterals::operator____L1
            ((char *)in_RDI,CONCAT17(local_d9,in_stack_ffffffffffffff10));
  pDVar3 = QHash<QString,_DomProperty_*>::value<QLatin1String,_true>
                     ((QHash<QString,_DomProperty_*> *)in_RDI,
                      (QLatin1String *)CONCAT17(local_d9,in_stack_ffffffffffffff10));
  if ((pDVar3 != (DomProperty *)0x0) &&
     (pDVar4 = DomProperty::elementStringList(pDVar3), pDVar4 != (DomStringList *)0x0)) {
    in_stack_ffffffffffffff88 = (DomWidget *)0xaaaaaaaaaaaaaaaa;
    in_stack_ffffffffffffff90 = (QString *)0xaaaaaaaaaaaaaaaa;
    DomProperty::elementStringList(pDVar3);
    DomStringList::elementString((DomStringList *)in_stack_ffffffffffffff08);
    bVar2 = QList<QString>::isEmpty((QList<QString> *)0x173c42);
    if (bVar2) {
LAB_00173c61:
      uVar6 = 1;
    }
    else {
      QList<QString>::constFirst((QList<QString> *)CONCAT17(local_d9,in_stack_ffffffffffffff10));
      bVar2 = QString::isEmpty((QString *)0x173c5b);
      if (bVar2) goto LAB_00173c61;
      QList<QString>::constFirst((QList<QString> *)CONCAT17(local_d9,in_stack_ffffffffffffff10));
      QList<QString>::append
                ((QList<QString> *)CONCAT17(local_d9,in_stack_ffffffffffffff10),
                 &in_stack_ffffffffffffff08->m_attr_name);
      qVar5 = QList<QString>::size((QList<QString> *)&stack0xffffffffffffff88);
      if (qVar5 < 2) {
        QString::QString((QString *)0x173d04);
      }
      else {
        QList<QString>::at((QList<QString> *)CONCAT17(local_d9,in_stack_ffffffffffffff10),
                           (qsizetype)in_stack_ffffffffffffff08);
        QString::QString((QString *)CONCAT17(local_d9,in_stack_ffffffffffffff10),
                         &in_stack_ffffffffffffff08->m_attr_name);
      }
      bVar2 = QString::isEmpty((QString *)0x173d0e);
      if (bVar2) {
        uVar6 = 1;
      }
      else {
        QMap<QString,_QList<QString>_>::operator[]
                  ((QMap<QString,_QList<QString>_> *)
                   CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                   &pDVar3->m_attr_name);
        QList<QString>::append
                  ((QList<QString> *)CONCAT17(local_d9,in_stack_ffffffffffffff10),
                   &in_stack_ffffffffffffff08->m_attr_name);
        qVar5 = QList<QString>::size((QList<QString> *)&stack0xffffffffffffff88);
        if (qVar5 < 3) {
          QString::QString((QString *)0x173da3);
        }
        else {
          QList<QString>::at((QList<QString> *)CONCAT17(local_d9,in_stack_ffffffffffffff10),
                             (qsizetype)in_stack_ffffffffffffff08);
          QString::QString((QString *)CONCAT17(local_d9,in_stack_ffffffffffffff10),
                           &in_stack_ffffffffffffff08->m_attr_name);
        }
        bVar2 = QString::isEmpty((QString *)0x173dad);
        if (!bVar2) {
          QMap<QString,_QList<QString>_>::operator[]
                    ((QMap<QString,_QList<QString>_> *)
                     CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                     &pDVar3->m_attr_name);
          QList<QString>::append
                    ((QList<QString> *)CONCAT17(local_d9,in_stack_ffffffffffffff10),
                     &in_stack_ffffffffffffff08->m_attr_name);
        }
        uVar6 = (uint)bVar2;
        QString::~QString((QString *)0x173def);
      }
      QString::~QString((QString *)0x173df9);
    }
    QList<QString>::~QList((QList<QString> *)0x173e06);
    if (uVar6 != 0) goto LAB_00173e29;
  }
  TreeWalker::acceptWidget((TreeWalker *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
LAB_00173e29:
  QHash<QString,_DomProperty_*>::~QHash
            ((QHash<QString,_DomProperty_*> *)CONCAT17(local_d9,in_stack_ffffffffffffff10));
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void DatabaseInfo::acceptWidget(DomWidget *node)
{
    QHash<QString, DomProperty*> properties = propertyMap(node->elementProperty());

    DomProperty *frameworkCode = properties.value("frameworkCode"_L1);
    if (frameworkCode && !toBool(frameworkCode->elementBool()))
        return;

    DomProperty *db = properties.value("database"_L1);
    if (db && db->elementStringList()) {
        QStringList info = db->elementStringList()->elementString();
        if (info.isEmpty() || info.constFirst().isEmpty())
            return;
        const QString &connection = info.constFirst();
        m_connections.append(connection);

        QString table = info.size() > 1 ? info.at(1) : QString();
        if (table.isEmpty())
            return;
        m_cursors[connection].append(table);

        QString field = info.size() > 2 ? info.at(2) : QString();
        if (field.isEmpty())
            return;
        m_fields[connection].append(field);
    }

    TreeWalker::acceptWidget(node);
}